

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam0000000000b55ae0 = 0x2e2e2e2e2e2e2e;
    uRam0000000000b55ae7._0_1_ = '.';
    uRam0000000000b55ae7._1_1_ = '.';
    uRam0000000000b55ae7._2_1_ = '.';
    uRam0000000000b55ae7._3_1_ = '.';
    uRam0000000000b55ae7._4_1_ = '.';
    uRam0000000000b55ae7._5_1_ = '.';
    uRam0000000000b55ae7._6_1_ = '.';
    uRam0000000000b55ae7._7_1_ = '.';
    DAT_00b55ad0 = '.';
    DAT_00b55ad0_1._0_1_ = '.';
    DAT_00b55ad0_1._1_1_ = '.';
    DAT_00b55ad0_1._2_1_ = '.';
    DAT_00b55ad0_1._3_1_ = '.';
    DAT_00b55ad0_1._4_1_ = '.';
    DAT_00b55ad0_1._5_1_ = '.';
    DAT_00b55ad0_1._6_1_ = '.';
    uRam0000000000b55ad8 = 0x2e2e2e2e2e2e2e;
    DAT_00b55adf = 0x2e;
    DAT_00b55ac0 = '.';
    DAT_00b55ac0_1._0_1_ = '.';
    DAT_00b55ac0_1._1_1_ = '.';
    DAT_00b55ac0_1._2_1_ = '.';
    DAT_00b55ac0_1._3_1_ = '.';
    DAT_00b55ac0_1._4_1_ = '.';
    DAT_00b55ac0_1._5_1_ = '.';
    DAT_00b55ac0_1._6_1_ = '.';
    uRam0000000000b55ac8._0_1_ = '.';
    uRam0000000000b55ac8._1_1_ = '.';
    uRam0000000000b55ac8._2_1_ = '.';
    uRam0000000000b55ac8._3_1_ = '.';
    uRam0000000000b55ac8._4_1_ = '.';
    uRam0000000000b55ac8._5_1_ = '.';
    uRam0000000000b55ac8._6_1_ = '.';
    uRam0000000000b55ac8._7_1_ = '.';
    DAT_00b55ab0 = '.';
    DAT_00b55ab0_1._0_1_ = '.';
    DAT_00b55ab0_1._1_1_ = '.';
    DAT_00b55ab0_1._2_1_ = '.';
    DAT_00b55ab0_1._3_1_ = '.';
    DAT_00b55ab0_1._4_1_ = '.';
    DAT_00b55ab0_1._5_1_ = '.';
    DAT_00b55ab0_1._6_1_ = '.';
    uRam0000000000b55ab8._0_1_ = '.';
    uRam0000000000b55ab8._1_1_ = '.';
    uRam0000000000b55ab8._2_1_ = '.';
    uRam0000000000b55ab8._3_1_ = '.';
    uRam0000000000b55ab8._4_1_ = '.';
    uRam0000000000b55ab8._5_1_ = '.';
    uRam0000000000b55ab8._6_1_ = '.';
    uRam0000000000b55ab8._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam0000000000b55aa8._0_1_ = '.';
    uRam0000000000b55aa8._1_1_ = '.';
    uRam0000000000b55aa8._2_1_ = '.';
    uRam0000000000b55aa8._3_1_ = '.';
    uRam0000000000b55aa8._4_1_ = '.';
    uRam0000000000b55aa8._5_1_ = '.';
    uRam0000000000b55aa8._6_1_ = '.';
    uRam0000000000b55aa8._7_1_ = '.';
    DAT_00b55aef = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}